

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgobs.cpp
# Opt level: O1

void init_font_window(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  Am_Object *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Constraint *pAVar5;
  Am_Object AVar6;
  Am_Object AVar7;
  Am_Object AVar8;
  Am_Object AVar9;
  Am_Object AVar10;
  Am_Object AVar11;
  Am_Object AVar12;
  Am_Object AVar13;
  ushort uVar14;
  Am_Object AStack_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object::Create((char *)&AStack_58);
  uVar14 = (ushort)&AStack_58;
  uVar2 = Am_Object::Set(uVar14,100,0x208);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0xfa);
  uVar2 = Am_Object::Set(uVar2,0x67,300);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(char *)0x6c,0x107144);
  Am_Object::operator=(&font_window,pAVar3);
  Am_Object::~Am_Object(&AStack_58);
  Am_Object::Create((char *)&AStack_58);
  uVar2 = Am_Object::Set(uVar14,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x107162);
  Am_Object::operator=(&font_text0,pAVar3);
  Am_Object::~Am_Object(&AStack_58);
  Am_Object::Create((char *)&AStack_58);
  AVar1 = PREV;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&font_text0);
  uVar2 = Am_Object::Add(uVar14,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,10);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)compute_text_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,(char *)0xab,0x107162);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&fixed_small);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar4);
  Am_Object::operator=(&font_text1,pAVar3);
  Am_Object::~Am_Object(&AStack_58);
  Am_Object::Create((char *)&AStack_58);
  AVar1 = PREV;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&font_text1);
  uVar2 = Am_Object::Add(uVar14,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,10);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)compute_text_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,(char *)0xab,0x107162);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&fixed_large);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar4);
  Am_Object::operator=(&font_text2,pAVar3);
  Am_Object::~Am_Object(&AStack_58);
  Am_Object::Create((char *)&AStack_58);
  AVar1 = PREV;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&font_text2);
  uVar2 = Am_Object::Add(uVar14,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,10);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)compute_text_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,(char *)0xab,0x107162);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&fixed_vl_bold_italic);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar4);
  Am_Object::operator=(&font_text3,pAVar3);
  Am_Object::~Am_Object(&AStack_58);
  Am_Object::Create((char *)&AStack_58);
  AVar1 = PREV;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&font_text3);
  uVar2 = Am_Object::Add(uVar14,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,10);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)compute_text_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,(char *)0xab,0x107162);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&times_medium);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar4);
  Am_Object::operator=(&font_text4,pAVar3);
  Am_Object::~Am_Object(&AStack_58);
  Am_Object::Create((char *)&AStack_58);
  AVar1 = PREV;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&font_text4);
  uVar2 = Am_Object::Add(uVar14,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,10);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)compute_text_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,(char *)0xab,0x107162);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&times_large_italic);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar4);
  Am_Object::operator=(&font_text5,pAVar3);
  Am_Object::~Am_Object(&AStack_58);
  Am_Object::Create((char *)&AStack_58);
  AVar1 = PREV;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&font_text5);
  uVar2 = Am_Object::Add(uVar14,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,10);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)compute_text_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,(char *)0xab,0x107162);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&helvetica_medium);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar4);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::operator=(&font_text6,pAVar3);
  Am_Object::~Am_Object(&AStack_58);
  Am_Object::Create((char *)&AStack_58);
  AVar1 = PREV;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&font_text6);
  uVar2 = Am_Object::Add(uVar14,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,10);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)compute_text_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,(char *)0xab,0x107162);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&helvetica_vl_bold);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar4);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,true,1);
  Am_Object::operator=(&font_text7,pAVar3);
  Am_Object::~Am_Object(&AStack_58);
  AVar1 = FONT_TEXT0_SLOT;
  Am_Object::Am_Object(&local_18,&font_text0);
  AVar6.data._2_6_ = 0;
  AVar6.data._0_2_ = AVar1;
  Am_Object::Add_Part(0x92b0,AVar6,(ulong)&local_18);
  Am_Object::~Am_Object(&local_18);
  AVar1 = FONT_TEXT1_SLOT;
  Am_Object::Am_Object(&local_20,&font_text1);
  AVar7.data._2_6_ = 0;
  AVar7.data._0_2_ = AVar1;
  Am_Object::Add_Part(0x92b0,AVar7,(ulong)&local_20);
  Am_Object::~Am_Object(&local_20);
  AVar1 = FONT_TEXT2_SLOT;
  Am_Object::Am_Object(&local_28,&font_text2);
  AVar8.data._2_6_ = 0;
  AVar8.data._0_2_ = AVar1;
  Am_Object::Add_Part(0x92b0,AVar8,(ulong)&local_28);
  Am_Object::~Am_Object(&local_28);
  AVar1 = FONT_TEXT3_SLOT;
  Am_Object::Am_Object(&local_30,&font_text3);
  AVar9.data._2_6_ = 0;
  AVar9.data._0_2_ = AVar1;
  Am_Object::Add_Part(0x92b0,AVar9,(ulong)&local_30);
  Am_Object::~Am_Object(&local_30);
  AVar1 = FONT_TEXT4_SLOT;
  Am_Object::Am_Object(&local_38,&font_text4);
  AVar10.data._2_6_ = 0;
  AVar10.data._0_2_ = AVar1;
  Am_Object::Add_Part(0x92b0,AVar10,(ulong)&local_38);
  Am_Object::~Am_Object(&local_38);
  AVar1 = FONT_TEXT5_SLOT;
  Am_Object::Am_Object(&local_40,&font_text5);
  AVar11.data._2_6_ = 0;
  AVar11.data._0_2_ = AVar1;
  Am_Object::Add_Part(0x92b0,AVar11,(ulong)&local_40);
  Am_Object::~Am_Object(&local_40);
  AVar1 = FONT_TEXT6_SLOT;
  Am_Object::Am_Object(&local_48,&font_text6);
  AVar12.data._2_6_ = 0;
  AVar12.data._0_2_ = AVar1;
  Am_Object::Add_Part(0x92b0,AVar12,(ulong)&local_48);
  Am_Object::~Am_Object(&local_48);
  AVar1 = FONT_TEXT7_SLOT;
  Am_Object::Am_Object(&local_50,&font_text7);
  AVar13.data._2_6_ = 0;
  AVar13.data._0_2_ = AVar1;
  Am_Object::Add_Part(0x92b0,AVar13,(ulong)&local_50);
  Am_Object::~Am_Object(&local_50);
  return;
}

Assistant:

void
init_font_window()
{

  font_window = Am_Window.Create("font_window")
                    .Set(Am_LEFT, 520)
                    .Set(Am_TOP, 10)
                    .Set(Am_WIDTH, 250)
                    .Set(Am_HEIGHT, 300)
                    .Set(Am_TITLE, "Testing Opal Fonts");

  font_text0 = Am_Text.Create("font_text0")
                   .Set(Am_LEFT, 10)
                   .Set(Am_TOP, 20)
                   .Set(Am_TEXT, "Font Test");

  font_text1 = Am_Text.Create("font_text1")
                   .Add(PREV, font_text0)
                   .Set(Am_LEFT, 10)
                   .Set(Am_TOP, compute_text_top)
                   .Set(Am_TEXT, "Font Test")
                   .Set(Am_FONT, fixed_small);

  font_text2 = Am_Text.Create("font_text2")
                   .Add(PREV, font_text1)
                   .Set(Am_LEFT, 10)
                   .Set(Am_TOP, compute_text_top)
                   .Set(Am_TEXT, "Font Test")
                   .Set(Am_FONT, fixed_large);

  font_text3 = Am_Text.Create("font_text3")
                   .Add(PREV, font_text2)
                   .Set(Am_LEFT, 10)
                   .Set(Am_TOP, compute_text_top)
                   .Set(Am_TEXT, "Font Test")
                   .Set(Am_FONT, fixed_vl_bold_italic);

  font_text4 = Am_Text.Create("font_text4")
                   .Add(PREV, font_text3)
                   .Set(Am_LEFT, 10)
                   .Set(Am_TOP, compute_text_top)
                   .Set(Am_TEXT, "Font Test")
                   .Set(Am_FONT, times_medium);

  font_text5 = Am_Text.Create("font_text5")
                   .Add(PREV, font_text4)
                   .Set(Am_LEFT, 10)
                   .Set(Am_TOP, compute_text_top)
                   .Set(Am_TEXT, "Font Test")
                   .Set(Am_FONT, times_large_italic);

  font_text6 = Am_Text.Create("font_text6")
                   .Add(PREV, font_text5)
                   .Set(Am_LEFT, 10)
                   .Set(Am_TOP, compute_text_top)
                   .Set(Am_TEXT, "Font Test")
                   .Set(Am_FONT, helvetica_medium)
                   .Set(Am_FILL_STYLE, Am_Red);

  font_text7 = Am_Text.Create("font_text7")
                   .Add(PREV, font_text6)
                   .Set(Am_LEFT, 10)
                   .Set(Am_TOP, compute_text_top)
                   .Set(Am_TEXT, "Font Test")
                   .Set(Am_FONT, helvetica_vl_bold)
                   .Set(Am_FILL_STYLE, Am_Red)
                   .Set(Am_INVERT, true);

  font_window.Add_Part(FONT_TEXT0_SLOT, font_text0);
  font_window.Add_Part(FONT_TEXT1_SLOT, font_text1);
  font_window.Add_Part(FONT_TEXT2_SLOT, font_text2);
  font_window.Add_Part(FONT_TEXT3_SLOT, font_text3);
  font_window.Add_Part(FONT_TEXT4_SLOT, font_text4);
  font_window.Add_Part(FONT_TEXT5_SLOT, font_text5);
  font_window.Add_Part(FONT_TEXT6_SLOT, font_text6);
  font_window.Add_Part(FONT_TEXT7_SLOT, font_text7);
}